

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase<Catch::CompactReporter>::StreamingReporterBase
          (StreamingReporterBase<Catch::CompactReporter> *this,ReporterConfig *_config)

{
  byte bVar1;
  ostream *poVar2;
  element_type *peVar3;
  size_type sVar4;
  ReusableStringStream *this_00;
  ReporterConfig *in_RSI;
  IStreamingReporter *in_RDI;
  ReporterConfig *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  key_type *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  string local_88 [32];
  domain_error local_68 [20];
  int local_54;
  ReporterConfig *local_10;
  
  local_10 = in_RSI;
  IStreamingReporter::IStreamingReporter(in_RDI);
  in_RDI->_vptr_IStreamingReporter = (_func_int **)&PTR__StreamingReporterBase_00266d10;
  ReporterConfig::fullConfig(in_stack_ffffffffffffff18);
  poVar2 = ReporterConfig::stream(local_10);
  in_RDI[3]._vptr_IStreamingReporter = (_func_int **)poVar2;
  LazyStat<Catch::TestRunInfo>::LazyStat
            ((LazyStat<Catch::TestRunInfo> *)
             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  LazyStat<Catch::GroupInfo>::LazyStat
            ((LazyStat<Catch::GroupInfo> *)
             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  LazyStat<Catch::TestCaseInfo>::LazyStat
            ((LazyStat<Catch::TestCaseInfo> *)
             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  clara::std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::vector
            ((vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_> *)0x1b84b7);
  ReporterPreferences::ReporterPreferences((ReporterPreferences *)(in_RDI + 0x2c));
  *(undefined1 *)&in_RDI[0x2c]._vptr_IStreamingReporter = 0;
  getSupportedVerbosities();
  peVar3 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1b84f1);
  local_54 = (*(peVar3->super_NonCopyable)._vptr_NonCopyable[0x14])();
  sVar4 = clara::std::
          set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_>::
          count((set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_>
                 *)CONCAT44(local_54,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28);
  bVar1 = sVar4 != 0 ^ 0xff;
  clara::std::set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_>
  ::~set((set<Catch::Verbosity,_std::less<Catch::Verbosity>,_std::allocator<Catch::Verbosity>_> *)
         0x1b854c);
  if ((bVar1 & 1) == 0) {
    return;
  }
  ReusableStringStream::ReusableStringStream
            ((ReusableStringStream *)CONCAT17(bVar1,in_stack_ffffffffffffff20));
  this_00 = ReusableStringStream::operator<<
                      ((ReusableStringStream *)CONCAT17(bVar1,in_stack_ffffffffffffff20),
                       (char (*) [47])in_stack_ffffffffffffff18);
  ReusableStringStream::str_abi_cxx11_(this_00);
  std::domain_error::domain_error(local_68,local_88);
  throw_exception<std::domain_error>((domain_error *)CONCAT17(bVar1,in_stack_ffffffffffffff20));
}

Assistant:

StreamingReporterBase( ReporterConfig const& _config )
        :   m_config( _config.fullConfig() ),
            stream( _config.stream() )
        {
            m_reporterPrefs.shouldRedirectStdOut = false;
            if( !DerivedT::getSupportedVerbosities().count( m_config->verbosity() ) )
                CATCH_ERROR( "Verbosity level not supported by this reporter" );
        }